

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddRectFilled
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,ImDrawFlags flags)

{
  if (0xffffff < col) {
    if (rounding < 0.5 || (flags & 0x1f0U) == 0x100) {
      PrimReserve(this,6,4);
      PrimRect(this,p_min,p_max,col);
      return;
    }
    PathRect(this,p_min,p_max,rounding,flags);
    AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilled(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawFlags flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (rounding < 0.5f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PrimReserve(6, 4);
        PrimRect(p_min, p_max, col);
    }
    else
    {
        PathRect(p_min, p_max, rounding, flags);
        PathFillConvex(col);
    }
}